

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

GLenum __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::textureType(GLTextureBuffer *this)

{
  uint uVar1;
  GLenum GVar2;
  string local_30;
  
  uVar1 = (this->super_TextureBuffer).dim - 1;
  if (uVar1 < 3) {
    GVar2 = *(GLenum *)(&DAT_00527178 + (ulong)uVar1 * 4);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"bad texture type","");
    exception(&local_30);
    GVar2 = 0xde0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return GVar2;
}

Assistant:

GLenum GLTextureBuffer::textureType() {
  if (dim == 1) {
    return GL_TEXTURE_1D;
  } else if (dim == 2) {
    return GL_TEXTURE_2D;
  } else if (dim == 3) {
    return GL_TEXTURE_3D;
  }
  exception("bad texture type");
  return GL_TEXTURE_1D;
}